

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsplashscreen.cpp
# Opt level: O0

int __thiscall QSplashScreen::qt_metacall(QSplashScreen *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined8 *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  void **in_RDI;
  long in_FS_OFFSET;
  int unaff_retaddr;
  Call unaff_retaddr_00;
  QObject *in_stack_00000008;
  QMetaType local_10;
  void **_a_00;
  
  _a_00 = *(void ***)(in_FS_OFFSET + 0x28);
  iVar1 = QWidget::qt_metacall
                    ((QWidget *)CONCAT44(in_ESI,in_EDX),(Call)((ulong)in_RCX >> 0x20),(int)in_RCX,
                     in_RDI);
  if (-1 < iVar1) {
    if (in_ESI == 0) {
      if (iVar1 < 5) {
        qt_static_metacall(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,_a_00);
      }
      iVar1 = iVar1 + -5;
    }
    if (in_ESI == 7) {
      if (iVar1 < 5) {
        memset(&local_10,0,8);
        QMetaType::QMetaType(&local_10);
        *(QMetaTypeInterface **)*in_RCX = local_10.d_ptr;
      }
      iVar1 = iVar1 + -5;
    }
  }
  if (*(void ***)(in_FS_OFFSET + 0x28) != _a_00) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

int QSplashScreen::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QWidget::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 5)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 5)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 5;
    }
    return _id;
}